

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O0

Vec_Int_t * Gia_ManInsePerform(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *p_00;
  abctime aVar5;
  abctime aVar6;
  char *pcVar7;
  bool bVar8;
  abctime clkTotal;
  abctime clk;
  uint local_58;
  int Cost0;
  int Cost;
  int iPat;
  int f;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vInputs;
  Vec_Int_t *vInit;
  Vec_Int_t *vRes;
  uint local_20;
  int fVerbose_local;
  int nWords_local;
  int nFrames_local;
  Vec_Int_t *vInit0_local;
  Gia_Man_t *p_local;
  
  vRes._4_4_ = fVerbose;
  local_20 = nWords;
  fVerbose_local = nFrames;
  _nWords_local = vInit0;
  vInit0_local = (Vec_Int_t *)p;
  aVar4 = Abc_Clock();
  Gia_ManRandomW(1);
  if (vRes._4_4_ != 0) {
    pcVar7 = "no ";
    if (_nWords_local != (Vec_Int_t *)0x0) {
      pcVar7 = "";
    }
    printf("Running with %d frames, %d words, and %sgiven init state.\n",(ulong)(uint)fVerbose_local
           ,(ulong)local_20,pcVar7);
  }
  p_00 = Vec_IntAlloc(0);
  vInputs = p_00;
  iVar1 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
  Vec_IntFill(p_00,iVar1,2);
  iVar1 = Gia_ManPiNum((Gia_Man_t *)vInit0_local);
  pObj = (Gia_Obj_t *)Vec_IntStart(iVar1 * fVerbose_local);
  Gia_ParTestAlloc((Gia_Man_t *)vInit0_local,local_20);
  Gia_ManInseInit((Gia_Man_t *)vInit0_local,vInputs);
  clk._4_4_ = 0;
  for (iPat = 0; iVar1 = iPat, iVar2 = Vec_IntSize(vInputs), iVar1 < iVar2; iPat = iPat + 1) {
    Cost0 = Vec_IntEntry(vInputs,iPat);
    clk._4_4_ = (Cost0 >> 1 & 1U) + clk._4_4_;
  }
  if (vRes._4_4_ != 0) {
    printf("Frame =%6d : Values =%6d (out of %6d)\n",0,(ulong)clk._4_4_,(ulong)clk._4_4_);
  }
  for (Cost = 0; Cost < fVerbose_local; Cost = Cost + 1) {
    aVar5 = Abc_Clock();
    iPat = 0;
    while( true ) {
      bVar8 = false;
      if (iPat < *(int *)&vInit0_local[1].pArray) {
        _f = Gia_ManObj((Gia_Man_t *)vInit0_local,iPat);
        bVar8 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      Gia_ManInseSimulateObj((Gia_Man_t *)vInit0_local,iPat);
      iPat = iPat + 1;
    }
    Cost0 = Gia_ManInseHighestScore((Gia_Man_t *)vInit0_local,(int *)&local_58);
    Gia_ManInseFindStarting((Gia_Man_t *)vInit0_local,Cost0,vInputs,(Vec_Int_t *)pObj);
    Gia_ManInseInit((Gia_Man_t *)vInit0_local,vInputs);
    if (vRes._4_4_ != 0) {
      printf("Frame =%6d : Values =%6d (out of %6d)   ",(ulong)(Cost + 1),(ulong)local_58,
             (ulong)clk._4_4_);
    }
    if (vRes._4_4_ != 0) {
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar6 - aVar5);
    }
  }
  Gia_ParTestFree((Gia_Man_t *)vInit0_local);
  vInit = Gia_ManInseSimulate((Gia_Man_t *)vInit0_local,_nWords_local,(Vec_Int_t *)pObj,vInputs);
  Vec_IntFreeP(&vInputs);
  Vec_IntFreeP((Vec_Int_t **)&pObj);
  iVar1 = Cost;
  uVar3 = Gia_ManRegNum((Gia_Man_t *)vInit0_local);
  printf("After %d frames, found a sequence to produce %d x-values (out of %d).  ",
         (ulong)(uint)iVar1,(ulong)local_58,(ulong)uVar3);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Total runtime",aVar5 - aVar4);
  return vInit;
}

Assistant:

Vec_Int_t * Gia_ManInsePerform( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int fVerbose )
{
    Vec_Int_t * vRes, * vInit, * vInputs;
    Gia_Obj_t * pObj;
    int i, f, iPat, Cost, Cost0;
    abctime clk, clkTotal = Abc_Clock();
    Gia_ManRandomW( 1 );
    if ( fVerbose )
        printf( "Running with %d frames, %d words, and %sgiven init state.\n", nFrames, nWords, vInit0 ? "":"no " );
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 2 );
    vInputs = Vec_IntStart( Gia_ManPiNum(p) * nFrames );
    Gia_ParTestAlloc( p, nWords );
    Gia_ManInseInit( p, vInit );
    Cost0 = 0;
    Vec_IntForEachEntry( vInit, iPat, i )
        Cost0 += ((iPat >> 1) & 1);
    if ( fVerbose )
        printf( "Frame =%6d : Values =%6d (out of %6d)\n", 0, Cost0, Cost0 );
    for ( f = 0; f < nFrames; f++ )
    {
        clk = Abc_Clock();
        Gia_ManForEachObj( p, pObj, i )
            Gia_ManInseSimulateObj( p, i );
        iPat = Gia_ManInseHighestScore( p, &Cost );
        Gia_ManInseFindStarting( p, iPat, vInit, vInputs );
        Gia_ManInseInit( p, vInit );
        if ( fVerbose )
            printf( "Frame =%6d : Values =%6d (out of %6d)   ", f+1, Cost, Cost0 );
        if ( fVerbose )
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Gia_ParTestFree( p );
    vRes = Gia_ManInseSimulate( p, vInit0, vInputs, vInit );
    Vec_IntFreeP( &vInit );
    Vec_IntFreeP( &vInputs );
    printf( "After %d frames, found a sequence to produce %d x-values (out of %d).  ", f, Cost, Gia_ManRegNum(p) );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vRes;
}